

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSerialPort.cpp
# Opt level: O0

int __thiscall PosixSerialPort::open(PosixSerialPort *this,char *__file,int __oflag,...)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int in_ECX;
  int iVar5;
  int in_R8D;
  bool bVar6;
  allocator<char> local_89;
  string local_88 [8];
  string dev;
  speed_t speed;
  termios options;
  StopBit stop_local;
  Parity parity_local;
  int data_local;
  int baud_local;
  PosixSerialPort *this_local;
  ulong uVar4;
  
  iVar5 = (int)__file;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar1 = ::open(pcVar3,0x902);
  this->_devfd = iVar1;
  if (this->_devfd == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_88,"/dev/",&local_89);
    std::allocator<char>::~allocator(&local_89);
    std::__cxx11::string::operator+=(local_88,(string *)&(this->super_SerialPort)._name);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = ::open(pcVar3,0x902);
    this->_devfd = iVar1;
    bVar6 = this->_devfd == -1;
    if (bVar6) {
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string(local_88);
    uVar4 = 0;
    if (bVar6) goto LAB_0011d168;
  }
  iVar1 = tcgetattr(this->_devfd,(termios *)((long)&dev.field_2 + 0xc));
  if (iVar1 == -1) {
    uVar2 = (*(this->super_SerialPort)._vptr_SerialPort[3])();
    uVar4 = (ulong)uVar2;
    this_local._7_1_ = 0;
  }
  else {
    if (iVar5 == 0x4b0) {
      dev.field_2._8_4_ = 9;
    }
    else if (iVar5 == 0x2580) {
      dev.field_2._8_4_ = 0xd;
    }
    else if (iVar5 == 0x4b00) {
      dev.field_2._8_4_ = 0xe;
    }
    else if (iVar5 == 0x9600) {
      dev.field_2._8_4_ = 0xf;
    }
    else if (iVar5 == 0xe100) {
      dev.field_2._8_4_ = 0x1001;
    }
    else if (iVar5 == 0x1c200) {
      dev.field_2._8_4_ = 0x1002;
    }
    else if (iVar5 == 0x38400) {
      dev.field_2._8_4_ = 0x1003;
    }
    else if (iVar5 == 0x70800) {
      dev.field_2._8_4_ = 0x1004;
    }
    else {
      if (iVar5 != 0xe1000) {
        uVar2 = (*(this->super_SerialPort)._vptr_SerialPort[3])();
        uVar4 = (ulong)uVar2;
        this_local._7_1_ = 0;
        goto LAB_0011d168;
      }
      dev.field_2._8_4_ = 0x1007;
    }
    iVar1 = cfsetispeed((termios *)((long)&dev.field_2 + 0xc),dev.field_2._8_4_);
    if ((iVar1 == 0) &&
       (iVar1 = cfsetospeed((termios *)((long)&dev.field_2 + 0xc),dev.field_2._8_4_), iVar1 == 0)) {
      if ((__oflag == 7) || (__oflag == 8)) {
        if (in_ECX == 0) {
          dev.field_2._12_4_ = dev.field_2._12_4_ & 0xffffffcf;
        }
        else if (in_ECX == 1) {
          dev.field_2._12_4_ = dev.field_2._12_4_ | 0x30;
        }
        else {
          if (in_ECX != 2) {
            uVar2 = (*(this->super_SerialPort)._vptr_SerialPort[3])();
            uVar4 = (ulong)uVar2;
            this_local._7_1_ = 0;
            goto LAB_0011d168;
          }
          dev.field_2._12_4_ = dev.field_2._12_4_ | 0x30;
        }
        if ((in_R8D == 0) || (in_R8D == 2)) {
          dev.field_2._12_4_ = dev.field_2._12_4_ & 0xffffe2fd;
          uVar2 = tcsetattr(this->_devfd,0,(termios *)((long)&dev.field_2 + 0xc));
          uVar4 = (ulong)uVar2;
          if (uVar2 == 0) {
            this_local._7_1_ = 1;
          }
          else {
            uVar2 = (*(this->super_SerialPort)._vptr_SerialPort[3])();
            uVar4 = (ulong)uVar2;
            this_local._7_1_ = 0;
          }
        }
        else {
          uVar2 = (*(this->super_SerialPort)._vptr_SerialPort[3])();
          uVar4 = (ulong)uVar2;
          this_local._7_1_ = 0;
        }
      }
      else {
        uVar2 = (*(this->super_SerialPort)._vptr_SerialPort[3])();
        uVar4 = (ulong)uVar2;
        this_local._7_1_ = 0;
      }
    }
    else {
      uVar2 = (*(this->super_SerialPort)._vptr_SerialPort[3])();
      uVar4 = (ulong)uVar2;
      this_local._7_1_ = 0;
    }
  }
LAB_0011d168:
  return (uint)CONCAT71((int7)(uVar4 >> 8),this_local._7_1_) & 0xffffff01;
}

Assistant:

bool
PosixSerialPort::open(int baud,
                      int data,
                      SerialPort::Parity parity,
                      SerialPort::StopBit stop)
{
    struct termios options;
    speed_t speed;
    // Try opening port assuming _name is full path. If it fails
    // try "/dev/" + _name
    _devfd = ::open(_name.c_str(), O_RDWR | O_NOCTTY | O_NDELAY);
    if (_devfd == -1)
    {
        std::string dev("/dev/");
        dev += _name;
        _devfd = ::open(dev.c_str(), O_RDWR | O_NOCTTY | O_NDELAY);
        if (_devfd == -1)
            return false;
    }

    if (tcgetattr(_devfd, &options) == -1)
    {
        close();
        return false;
    }

    switch (baud)
    {
    case 1200:
        speed = B1200;
        break;
    case 9600:
        speed = B9600;
        break;
    case 19200:
        speed = B19200;
        break;
    case 38400:
        speed = B38400;
        break;
    case 57600:
        speed = B57600;
        break;
    case 115200:
        speed = B115200;
        break;
    case 230400:
        speed = B230400;
        break;
    case 460800:
        speed = B460800;
        break;
    case 921600:
        speed = B921600;
        break;
    default:
        close();
        return false;
    }

    if (cfsetispeed(&options, speed) || cfsetospeed(&options, speed))
    {
        close();
        return false;
    }

    options.c_cflag |= (CLOCAL | CREAD);

    switch (data)
    {
        case 8:
            options.c_cflag &= ~CSIZE;
            options.c_cflag |= CS8;
            break;
        case 7:
            options.c_cflag &= ~CSIZE;
            options.c_cflag |= CS7;
            break;
        default:
            close();
            return false;
    }

    switch (parity)
    {
        case SerialPort::ParityNone:
            options.c_cflag &= ~PARENB;
            options.c_cflag &= ~PARODD;
            options.c_iflag &= ~(INPCK | ISTRIP);
            break;
        case SerialPort::ParityOdd:
            options.c_cflag |= PARENB;
            options.c_cflag |= PARODD;
            options.c_iflag |= (INPCK | ISTRIP);
            break;
        case SerialPort::ParityEven:
            options.c_cflag |= PARENB;
            options.c_cflag &= ~PARODD;
            options.c_iflag |= (INPCK | ISTRIP);
            break;
        default:
            close();
            return false;
    }

    switch (stop)
    {
    case StopBitOne:
        options.c_cflag &= ~CSTOPB;
        break;
    case StopBitTwo:
        options.c_cflag |= CSTOPB;
        break;
    default:
        close();
        return false;
    }

    // No hardware flow control
    options.c_cflag &= ~CRTSCTS;

    // No software flow control
    options.c_iflag &= ~(IXON | IXOFF | IXANY);

    // Raw input
    options.c_iflag &= ~(BRKINT | ICRNL);
    options.c_lflag &= ~(ICANON | IEXTEN | ECHO | ECHOE | ISIG);

    // Raw output
    options.c_oflag &= ~OPOST;

    // No wait time
    options.c_cc[VMIN]  = 0;
    options.c_cc[VTIME] = 0;

    if (tcsetattr(_devfd, TCSANOW, &options))
    {
        close();
        return false;
    }

    return true;
}